

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void jsonParseFree(JsonParse *pParse)

{
  if (pParse != (JsonParse *)0x0) {
    if (pParse->nJPRef < 2) {
      jsonParseReset(pParse);
      sqlite3DbFreeNN(pParse->db,pParse);
      return;
    }
    pParse->nJPRef = pParse->nJPRef - 1;
  }
  return;
}

Assistant:

static void jsonParseFree(JsonParse *pParse){
  if( pParse ){
    if( pParse->nJPRef>1 ){
      pParse->nJPRef--;
    }else{
      jsonParseReset(pParse);
      sqlite3DbFree(pParse->db, pParse);
    }
  }
}